

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
::_decodeArray<unsigned_int>
          (CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
           *this,uint32_t *in,size_t length,uint *out,size_t *nvalue)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  logic_error *plVar4;
  uint32_t *puVar5;
  size_t *in_RDX;
  uint32_t *in_RSI;
  VariableByte *in_RDI;
  ulong *in_R8;
  SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *unaff_retaddr;
  uint32_t *in3;
  size_t nvalue2;
  uint32_t *in2;
  size_t mynvalue1;
  uint32_t *initin;
  uint32_t *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  uint32_t *in_stack_ffffffffffffff88;
  uint32_t *in_stack_fffffffffffffff8;
  
  if (*in_R8 != 0) {
    uVar1 = *in_R8;
    puVar5 = in_RSI;
    puVar3 = SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
                       (unaff_retaddr,in_stack_fffffffffffffff8,(size_t)in_RDI,in_RSI,in_RDX);
    if (puVar3 < puVar5 + (long)in_RDX) {
      if (*in_R8 <= uVar1) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar4,"Buffer contains more data than requested!");
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar2 = *in_R8;
      puVar5 = VariableByte::decodeArray
                         (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78,(size_t *)0x160829);
      *in_R8 = uVar1 + (uVar2 - uVar1);
      puVar3 = in_RSI + (long)in_RDX;
      in_RSI = puVar5;
      if (puVar3 < puVar5) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar4,"Decode run over output buffer. Potential buffer overflow!");
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    else {
      *in_R8 = uVar1;
      puVar5 = in_RSI + (long)in_RDX;
      in_RSI = puVar3;
      if (puVar5 < puVar3) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar4,"Decode run over output buffer. Potential buffer overflow!");
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  return in_RSI;
}

Assistant:

const uint32_t *_decodeArray(const uint32_t *in, const size_t length,
                               IntType *out, size_t &nvalue) {
    if (nvalue == 0) {
      return in;
    }
    const uint32_t *const initin(in);
    size_t mynvalue1 = nvalue;
    const uint32_t *in2 = codec1.decodeArray(in, length, out, mynvalue1);
    if (length + in > in2) {
      if (nvalue <= mynvalue1) {
        throw std::logic_error("Buffer contains more data than requested!");
      }
      size_t nvalue2 = nvalue - mynvalue1;
      const uint32_t *in3 = codec2.decodeArray(in2, length - (in2 - in),
                                               out + mynvalue1, nvalue2);
      nvalue = mynvalue1 + nvalue2;
      if (initin + length < in3) {
        throw std::logic_error(
            "Decode run over output buffer. Potential buffer overflow!");
      }
      return in3;
    }
    nvalue = mynvalue1;
    if (initin + length < in2) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }
    return in2;
  }